

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

bool cmQtAutoGen::RccListParseOutput
               (string *rccStdOut,string *rccStdErr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  long lVar7;
  string oline;
  istringstream ostr;
  string local_200;
  value_type local_1e0;
  string *local_1c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_1b8;
  long local_1b0 [15];
  ios_base local_138 [264];
  
  local_1c0 = error;
  local_1b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)rccStdOut,_S_in);
  paVar1 = &local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  while( true ) {
    cVar3 = (char)(istringstream *)local_1b0;
    cVar4 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar3);
    piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_1e0,cVar4);
    if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
    lVar7 = std::__cxx11::string::find((char)&local_1e0,0xd);
    if (lVar7 != -1) {
      std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_1e0);
      std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
    }
    if (local_1e0._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b8,&local_1e0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)rccStdErr,_S_in);
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  do {
    do {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + cVar3);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1b0,(string *)&local_1e0,cVar4);
      uVar2 = *(uint *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18) + 0x20);
      if ((uVar2 & 5) != 0) goto LAB_003e8ca3;
      lVar7 = std::__cxx11::string::find((char)&local_1e0,0xd);
      if (lVar7 != -1) {
        std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_1e0);
        std::__cxx11::string::operator=((string *)&local_1e0,(string *)&local_200);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._M_dataplus._M_p != &local_200.field_2) {
          operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
        }
      }
      iVar5 = strncmp(local_1e0._M_dataplus._M_p,"RCC: Error in",0xd);
    } while (iVar5 != 0);
    if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
         ::searchString_abi_cxx11_ == '\0') &&
       (iVar5 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                     ::searchString_abi_cxx11_), iVar5 != 0)) {
      RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
      ::searchString_abi_cxx11_._M_dataplus._M_p =
           (pointer)&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                     ::searchString_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                  ::searchString_abi_cxx11_,"Cannot find file \'","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                    ::searchString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                           ::searchString_abi_cxx11_);
    }
    lVar7 = std::__cxx11::string::find
                      ((char *)&local_1e0,
                       (ulong)RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                              ::searchString_abi_cxx11_._M_dataplus._M_p,0);
    if (lVar7 == -1) {
      std::__cxx11::string::_M_replace
                ((ulong)local_1c0,0,(char *)local_1c0->_M_string_length,0x56b0ea);
      Quoted(&local_200,&local_1e0);
      std::__cxx11::string::_M_append((char *)local_1c0,(ulong)local_200._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)local_1c0);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_200,(ulong)&local_1e0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>(local_1b8,&local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
    }
  } while (lVar7 != -1);
LAB_003e8ca3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT71(local_1e0.field_2._M_allocated_capacity._1_7_,
                             local_1e0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
  std::ios_base::~ios_base(local_138);
  return (uVar2 & 5) != 0;
}

Assistant:

bool cmQtAutoGen::RccListParseOutput(std::string const& rccStdOut,
                                     std::string const& rccStdErr,
                                     std::vector<std::string>& files,
                                     std::string& error)
{
  // Lambda to strip CR characters
  auto StripCR = [](std::string& line) {
    std::string::size_type cr = line.find('\r');
    if (cr != std::string::npos) {
      line = line.substr(0, cr);
    }
  };

  // Parse rcc std output
  {
    std::istringstream ostr(rccStdOut);
    std::string oline;
    while (std::getline(ostr, oline)) {
      StripCR(oline);
      if (!oline.empty()) {
        files.push_back(oline);
      }
    }
  }
  // Parse rcc error output
  {
    std::istringstream estr(rccStdErr);
    std::string eline;
    while (std::getline(estr, eline)) {
      StripCR(eline);
      if (cmHasLiteralPrefix(eline, "RCC: Error in")) {
        static std::string const searchString = "Cannot find file '";

        std::string::size_type pos = eline.find(searchString);
        if (pos == std::string::npos) {
          error = "rcc lists unparsable output:\n";
          error += cmQtAutoGen::Quoted(eline);
          error += "\n";
          return false;
        }
        pos += searchString.length();
        std::string::size_type sz = eline.size() - pos - 1;
        files.push_back(eline.substr(pos, sz));
      }
    }
  }

  return true;
}